

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

sysbvm_tuple_t sysbvm_context_shallowCopy(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  _Bool _Var1;
  size_t newIdentityHash;
  sysbvm_object_tuple_t *result;
  sysbvm_tuple_t tuple_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(tuple);
  context_local = (sysbvm_context_t *)tuple;
  if (_Var1) {
    context_local =
         (sysbvm_context_t *)
         sysbvm_heap_shallowCopyTuple(&context->heap,(sysbvm_object_tuple_t *)tuple);
    newIdentityHash = sysbvm_context_generateIdentityHash(context);
    sysbvm_tuple_setIdentityHash((sysbvm_object_tuple_t *)context_local,newIdentityHash);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_context_shallowCopy(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    if(!sysbvm_tuple_isNonNullPointer(tuple))
        return tuple;

    sysbvm_object_tuple_t *result = sysbvm_heap_shallowCopyTuple(&context->heap, (sysbvm_object_tuple_t*)tuple);
    sysbvm_tuple_setIdentityHash(result, sysbvm_context_generateIdentityHash(context));
    return (sysbvm_tuple_t)result;    
}